

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

ostream * Imath_3_2::operator<<(ostream *s,Matrix44<float> *m)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  uint uVar4;
  fmtflags __old;
  long lVar5;
  int iVar6;
  
  lVar5 = *(long *)s;
  poVar3 = s + *(long *)(lVar5 + -0x18) + 0x18;
  uVar1 = *(uint *)poVar3;
  if ((uVar1 & 4) == 0) {
    *(uint *)poVar3 = uVar1 | 0x100;
    poVar3 = s + *(long *)(lVar5 + -0x18) + 0x18;
    iVar6 = 8;
    uVar4 = *(uint *)poVar3;
  }
  else {
    iVar6 = 5;
    uVar4 = uVar1;
  }
  *(uint *)poVar3 = uVar4 | 0x400;
  iVar2 = *(int *)(s + *(long *)(lVar5 + -0x18) + 8);
  poVar3 = std::operator<<(s,"(");
  lVar5 = (long)(iVar6 + iVar2);
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[0][0]);
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[0][1]);
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[0][2]);
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[0][3]);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[1][0]);
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[1][1]);
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[1][2]);
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[1][3]);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[2][0]);
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[2][1]);
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[2][2]);
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[2][3]);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[3][0]);
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[3][1]);
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[3][2]);
  poVar3 = std::operator<<(poVar3," ");
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->x[3][3]);
  std::operator<<(poVar3,")\n");
  *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) = uVar1;
  return s;
}

Assistant:

std::ostream&
operator<< (std::ostream& s, const Matrix44<T>& m)
{
    std::ios_base::fmtflags oldFlags = s.flags ();
    int                     width;

    if (s.flags () & std::ios_base::fixed)
    {
        s.setf (std::ios_base::showpoint);
        width = static_cast<int> (s.precision ()) + 5;
    }
    else
    {
        s.setf (std::ios_base::scientific);
        s.setf (std::ios_base::showpoint);
        width = static_cast<int> (s.precision ()) + 8;
    }

    s << "(" << std::setw (width) << m[0][0] << " " << std::setw (width)
      << m[0][1] << " " << std::setw (width) << m[0][2] << " "
      << std::setw (width) << m[0][3] << "\n"
      <<

        " " << std::setw (width) << m[1][0] << " " << std::setw (width)
      << m[1][1] << " " << std::setw (width) << m[1][2] << " "
      << std::setw (width) << m[1][3] << "\n"
      <<

        " " << std::setw (width) << m[2][0] << " " << std::setw (width)
      << m[2][1] << " " << std::setw (width) << m[2][2] << " "
      << std::setw (width) << m[2][3] << "\n"
      <<

        " " << std::setw (width) << m[3][0] << " " << std::setw (width)
      << m[3][1] << " " << std::setw (width) << m[3][2] << " "
      << std::setw (width) << m[3][3] << ")\n";

    s.flags (oldFlags);
    return s;
}